

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

_Bool have_controlling_tty(void)

{
  int __fd;
  int *piVar1;
  
  __fd = open("/dev/tty",0);
  if (__fd < 0) {
    piVar1 = __errno_location();
    if (*piVar1 != 6) {
      perror("/dev/tty: open");
      exit(1);
    }
  }
  else {
    close(__fd);
  }
  return -1 < __fd;
}

Assistant:

bool have_controlling_tty(void)
{
    int fd = open("/dev/tty", O_RDONLY);
    if (fd < 0) {
        if (errno != ENXIO) {
            perror("/dev/tty: open");
            exit(1);
        }
        return false;
    } else {
        close(fd);
        return true;
    }
}